

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

string * __thiscall
loguru::stacktrace_as_stdstring_abi_cxx11_(string *__return_storage_ptr__,loguru *this,int skip)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  char *__ptr_00;
  undefined4 in_register_00000014;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  int status;
  string result;
  Dl_info info;
  char buf [1024];
  void *callstack [128];
  
  iVar1 = backtrace(callstack,0x80,CONCAT44(in_register_00000014,skip));
  __ptr = (void *)backtrace_symbols(callstack,iVar1);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  uVar3 = (uint)this;
  if ((int)uVar3 < iVar1) {
    lVar7 = (long)iVar1;
    uVar4 = ~uVar3 + iVar1;
    do {
      iVar2 = dladdr(callstack[lVar7 + -1],&info);
      if (info.dli_sname == (char *)0x0 || iVar2 == 0) {
        snprintf(buf,0x400,"%-3d %*p %s\n",(ulong)uVar4,0x12,callstack[lVar7 + -1],
                 *(undefined8 *)((long)__ptr + lVar7 * 8 + -8));
      }
      else {
        status = -1;
        if (*info.dli_sname == '_') {
          __ptr_00 = (char *)__cxa_demangle(info.dli_sname,0,0,&status);
          pvVar5 = callstack[lVar7 + -1];
          pcVar6 = __ptr_00;
          if ((status != 0) && (pcVar6 = info.dli_sname, info.dli_sname == (char *)0x0)) {
            pcVar6 = *(char **)((long)__ptr + lVar7 * 8 + -8);
          }
        }
        else {
          pvVar5 = callstack[lVar7 + -1];
          __ptr_00 = (char *)0x0;
          pcVar6 = info.dli_sname;
        }
        snprintf(buf,0x400,"%-3d %*p %s + %zd\n",(ulong)uVar4,0x12,pvVar5,pcVar6,
                 (long)pvVar5 - (long)info.dli_saddr);
        free(__ptr_00);
      }
      std::__cxx11::string::append((char *)&result);
      lVar7 = lVar7 + -1;
      uVar4 = uVar4 - 1;
    } while ((int)uVar3 < lVar7);
  }
  free(__ptr);
  if (iVar1 == 0x80) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                   "[truncated]\n",&result);
    std::__cxx11::string::operator=((string *)&result,(string *)buf);
    if ((char *)buf._0_8_ != buf + 0x10) {
      operator_delete((void *)buf._0_8_,buf._16_8_ + 1);
    }
  }
  if ((result._M_string_length != 0) &&
     (result._M_dataplus._M_p[result._M_string_length - 1] == '\n')) {
    std::__cxx11::string::resize((ulong)&result,(char)result._M_string_length + -1);
  }
  prettify_stacktrace(__return_storage_ptr__,&result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p,
                    CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                             result.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stacktrace_as_stdstring(int skip)
	{
		// From https://gist.github.com/fmela/591333
		void* callstack[128];
		const auto max_frames = sizeof(callstack) / sizeof(callstack[0]);
		int num_frames = backtrace(callstack, max_frames);
		char** symbols = backtrace_symbols(callstack, num_frames);

		std::string result;
		// Print stack traces so the most relevant ones are written last
		// Rationale: http://yellerapp.com/posts/2015-01-22-upside-down-stacktraces.html
		for (int i = num_frames - 1; i >= skip; --i) {
			char buf[1024];
			Dl_info info;
			if (dladdr(callstack[i], &info) && info.dli_sname) {
				char* demangled = NULL;
				int status = -1;
				if (info.dli_sname[0] == '_') {
					demangled = abi::__cxa_demangle(info.dli_sname, 0, 0, &status);
				}
				snprintf(buf, sizeof(buf), "%-3d %*p %s + %zd\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i],
						 status == 0 ? demangled :
						 info.dli_sname == 0 ? symbols[i] : info.dli_sname,
						 static_cast<char*>(callstack[i]) - static_cast<char*>(info.dli_saddr));
				free(demangled);
			} else {
				snprintf(buf, sizeof(buf), "%-3d %*p %s\n",
						 i - skip, int(2 + sizeof(void*) * 2), callstack[i], symbols[i]);
			}
			result += buf;
		}
		free(symbols);

		if (num_frames == max_frames) {
			result = "[truncated]\n" + result;
		}

		if (!result.empty() && result[result.size() - 1] == '\n') {
			result.resize(result.size() - 1);
		}

		return prettify_stacktrace(result);
	}